

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::formatReconstructedExpression(Catch *this,ostream *os,string *lhs,StringRef op,string *rhs)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  StringRef op_local;
  
  op_local.m_size = (size_type)op.m_start;
  op_local.m_start = (char *)lhs;
  if ((ulong)(*(long *)((string *)op.m_size + 8) + *(long *)(os + 8)) < 0x28) {
    lVar1 = std::__cxx11::string::find((char)os,10);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char)op.m_size,10);
      if (lVar1 == -1) {
        pcVar3 = " ";
        goto LAB_00183a1d;
      }
    }
  }
  pcVar3 = "\n";
LAB_00183a1d:
  poVar2 = std::operator<<((ostream *)this,(string *)os);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = operator<<(poVar2,&op_local);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,(string *)op.m_size);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << " " << op << " " << rhs;
        else
            os << lhs << "\n" << op << "\n" << rhs;
    }